

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

bool __thiscall
QGraphicsItem::collidesWithPath(QGraphicsItem *this,QPainterPath *path,ItemSelectionMode mode)

{
  bool bVar1;
  byte bVar2;
  ulong uVar3;
  QGraphicsItemPrivate *pQVar4;
  int in_EDX;
  QPainterPath *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  QPainterPath thisShape;
  QRectF rectB;
  QRectF rectA;
  QPainterPath *in_stack_ffffffffffffff68;
  undefined6 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff76;
  undefined1 in_stack_ffffffffffffff77;
  bool local_61;
  QGraphicsItem *in_stack_ffffffffffffffa0;
  QPainterPath local_58 [8];
  undefined1 *local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = QPainterPath::isEmpty();
  if ((uVar3 & 1) == 0) {
    local_28 = 0xffffffffffffffff;
    local_20 = 0xffffffffffffffff;
    local_18 = 0xffffffffffffffff;
    local_10 = 0xffffffffffffffff;
    (**(code **)(*in_RDI + 0x18))(&local_28);
    _q_adjustRect((QRectF *)0x98128e);
    local_48 = 0xffffffffffffffff;
    local_40 = 0xffffffffffffffff;
    local_38 = 0xffffffffffffffff;
    local_30 = 0xffffffffffffffff;
    QPainterPath::controlPointRect();
    _q_adjustRect((QRectF *)0x9812d7);
    uVar3 = QRectF::intersects((QRectF *)&local_28);
    if ((uVar3 & 1) == 0) {
      local_61 = false;
    }
    else {
      local_50 = &DAT_aaaaaaaaaaaaaaaa;
      QPainterPath::QPainterPath((QPainterPath *)&local_50);
      if ((in_EDX == 1) || (in_EDX == 0)) {
        bVar1 = isClipped((QGraphicsItem *)
                          CONCAT17(in_stack_ffffffffffffff77,
                                   CONCAT16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70)));
        if ((bVar1) &&
           (pQVar4 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                     ::operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                                   *)(in_RDI + 1)),
           (*(ulong *)&pQVar4->field_0x160 >> 0x1b & 1) == 0)) {
          clipPath(in_stack_ffffffffffffffa0);
        }
        else {
          (**(code **)(*in_RDI + 0x20))(local_58);
        }
        QPainterPath::operator=
                  ((QPainterPath *)
                   CONCAT17(in_stack_ffffffffffffff77,
                            CONCAT16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70)),
                   in_stack_ffffffffffffff68);
        QPainterPath::~QPainterPath(local_58);
      }
      else {
        QPainterPath::addRect((QRectF *)&local_50);
      }
      QPainterPath::QPainterPath((QPainterPath *)&stack0xffffffffffffffa0);
      bVar2 = QPainterPath::operator==
                        ((QPainterPath *)&local_50,(QPainterPath *)&stack0xffffffffffffffa0);
      QPainterPath::~QPainterPath((QPainterPath *)&stack0xffffffffffffffa0);
      if ((bVar2 & 1) == 0) {
        if ((in_EDX == 1) || (in_EDX == 3)) {
          bVar2 = QPainterPath::intersects(in_RSI);
          local_61 = (bool)(bVar2 & 1);
        }
        else {
          bVar2 = QPainterPath::contains(in_RSI);
          local_61 = (bool)(bVar2 & 1);
        }
      }
      else {
        local_61 = false;
      }
      QPainterPath::~QPainterPath((QPainterPath *)&local_50);
    }
  }
  else {
    local_61 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_61;
}

Assistant:

bool QGraphicsItem::collidesWithPath(const QPainterPath &path, Qt::ItemSelectionMode mode) const
{
    if (path.isEmpty()) {
        // No collision with empty paths.
        return false;
    }

    QRectF rectA(boundingRect());
    _q_adjustRect(&rectA);
    QRectF rectB(path.controlPointRect());
    _q_adjustRect(&rectB);
    if (!rectA.intersects(rectB)) {
        // This we can determine efficiently. If the two rects neither
        // intersect nor contain each other, then the two items do not collide.
        return false;
    }

    // For further testing, we need this item's shape or bounding rect.
    QPainterPath thisShape;
    if (mode == Qt::IntersectsItemShape || mode == Qt::ContainsItemShape)
        thisShape = (isClipped() && !d_ptr->localCollisionHack) ? clipPath() : shape();
    else
        thisShape.addRect(rectA);

    if (thisShape == QPainterPath()) {
        // Empty shape? No collision.
        return false;
    }

    // Use QPainterPath boolean operations to determine the collision, O(N*logN).
    if (mode == Qt::IntersectsItemShape || mode == Qt::IntersectsItemBoundingRect)
        return path.intersects(thisShape);
    return path.contains(thisShape);
}